

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O2

bool __thiscall
cppcms::impl::file_server::is_in_root
          (file_server *this,string *input_path,string *root,string *real)

{
  bool bVar1;
  file_server *this_00;
  string normal;
  undefined1 auStack_88 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = (file_server *)auStack_88;
  std::operator+(&local_48,root,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (auStack_88 + 0x20),&local_48,input_path);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)auStack_88,(string *)(auStack_88 + 0x20));
  bVar1 = canonical(this_00,(string *)auStack_88,real);
  std::__cxx11::string::~string((string *)auStack_88);
  if (bVar1) {
    bVar1 = is_file_prefix(root,real);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)(auStack_88 + 0x20));
  return bVar1;
}

Assistant:

bool file_server::is_in_root(std::string const &input_path,std::string const &root,std::string &real)
{
	std::string normal=root + "/" + input_path;
	if(!canonical(normal,real))
		return false;
	if(!is_file_prefix(root,real))
		return false;
	return true;
}